

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZHybridizeHDiv.cpp
# Opt level: O0

tuple<long,_int> __thiscall
TPZHybridizeHDiv::SplitConnects
          (TPZHybridizeHDiv *this,TPZCompElSide *left,TPZCompElSide *right,
          TPZVec<TPZCompMesh_*> *meshvec_Hybrid)

{
  long *plVar1;
  byte bVar2;
  uchar uVar3;
  int iVar4;
  ostream *this_00;
  TPZCompMesh **ppTVar5;
  TPZCompEl *pTVar6;
  int64_t iVar7;
  TPZCompElSide *pTVar8;
  TPZGeoEl *pTVar9;
  TPZCompElSide *in_RCX;
  TPZCompElSide *in_RDX;
  _Head_base<0UL,_long,_false> extraout_RDX;
  int *in_RSI;
  undefined8 in_RDI;
  TPZVec<TPZCompMesh_*> *in_R8;
  tuple<long,_int> tVar10;
  size_t in_stack_000000c8;
  char *in_stack_000000d0;
  TPZGeoElBC gbc_2;
  int pressureorder;
  int lagmatid;
  int64_t pressureindex;
  int wrapside_1;
  TPZInterpolatedElement *intel_1;
  TPZGeoElBC gbc_1;
  int rightprevorder;
  TPZConnect *cright;
  int wrapside;
  TPZInterpolatedElement *intel;
  TPZGeoElBC gbc;
  TPZCompEl *wrap2;
  TPZCompEl *wrap1;
  int sideorder;
  TPZConnect *cleft;
  TPZStack<TPZCompElSide,_10> equalright;
  TPZInterpolatedElement *intelright;
  TPZInterpolatedElement *intelleft;
  TPZGeoElSide gright;
  TPZGeoElSide gleft;
  TPZCompMesh *fluxmesh;
  TPZConnect *in_stack_fffffffffffffcb0;
  TPZCompMesh *in_stack_fffffffffffffcb8;
  TPZGeoEl *in_stack_fffffffffffffcc0;
  TPZCreateApproximationSpace *in_stack_fffffffffffffcc8;
  TPZGeoEl *in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  long *local_318;
  TPZCompElSide *in_stack_fffffffffffffd28;
  TPZCompElSide *in_stack_fffffffffffffd30;
  long *local_290;
  undefined8 in_stack_fffffffffffffdb0;
  TPZStack<TPZCompElSide,_10> *in_stack_fffffffffffffdb8;
  TPZGeoElSide *in_stack_fffffffffffffdc0;
  long *local_1f0;
  long *local_1e0;
  TPZGeoElBC local_1b8;
  uint local_1b0;
  int local_1ac;
  int64_t local_1a8;
  int local_19c;
  long *local_198;
  TPZGeoElBC local_190;
  uint local_184;
  TPZConnect *local_180;
  int local_174;
  long *local_170;
  TPZGeoElBC local_168;
  TPZCompMesh *local_160;
  TPZCompEl *local_158;
  uint local_14c;
  TPZConnect *local_148;
  TPZVec<TPZCompElSide> local_140 [6];
  long *local_80;
  long *local_78;
  TPZCompMesh *local_30;
  TPZVec<TPZCompMesh_*> *local_28;
  TPZCompElSide *local_20;
  TPZCompElSide *local_18;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  if ((*in_RSI == 0) || (in_RSI[1] == 0)) {
    this_00 = std::operator<<((ostream *)&std::cerr,
                              "Using uninitialized TPZHybridizeHDiv object. You need to call ComputePeriferalMaterialIds function first!"
                             );
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    pzinternal::DebugStopImpl(in_stack_000000d0,in_stack_000000c8);
  }
  ppTVar5 = TPZVec<TPZCompMesh_*>::operator[](local_28,0);
  local_30 = *ppTVar5;
  TPZCompElSide::Reference((TPZCompElSide *)in_stack_fffffffffffffcc8);
  TPZCompElSide::Reference((TPZCompElSide *)in_stack_fffffffffffffcc8);
  pTVar6 = TPZCompElSide::Element(local_18);
  if (pTVar6 == (TPZCompEl *)0x0) {
    local_1e0 = (long *)0x0;
  }
  else {
    local_1e0 = (long *)__dynamic_cast(pTVar6,&TPZCompEl::typeinfo,&TPZInterpolatedElement::typeinfo
                                       ,0);
  }
  local_78 = local_1e0;
  pTVar6 = TPZCompElSide::Element(local_20);
  if (pTVar6 == (TPZCompEl *)0x0) {
    local_1f0 = (long *)0x0;
  }
  else {
    local_1f0 = (long *)__dynamic_cast(pTVar6,&TPZCompEl::typeinfo,&TPZInterpolatedElement::typeinfo
                                       ,0);
  }
  plVar1 = local_78;
  local_80 = local_1f0;
  iVar4 = TPZCompElSide::Side(local_18);
  (**(code **)(*plVar1 + 0x2f8))(plVar1,iVar4,1);
  plVar1 = local_80;
  iVar4 = TPZCompElSide::Side(local_20);
  (**(code **)(*plVar1 + 0x2f8))(plVar1,iVar4,1);
  TPZStack<TPZCompElSide,_10>::TPZStack((TPZStack<TPZCompElSide,_10> *)in_stack_fffffffffffffcc0);
  TPZCompElSide::Side(local_18);
  local_148 = TPZInterpolatedElement::SideConnect
                        ((TPZInterpolatedElement *)
                         CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                         (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
                         (int)in_stack_fffffffffffffcd0);
  iVar4 = TPZConnect::HasDependency(local_148);
  if (iVar4 == 0) {
    TPZCompElSide::SplitConnect(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  }
  else {
    TPZGeoElSide::EqualLevelCompElementList
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20),(int)in_stack_fffffffffffffdb0);
    iVar7 = TPZVec<TPZCompElSide>::size(local_140);
    if (iVar7 != 0) {
      pTVar8 = TPZVec<TPZCompElSide>::operator[](local_140,0);
      TPZCompElSide::Element(pTVar8);
      pTVar9 = TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffffcb8);
      TPZGeoEl::ResetReference(pTVar9);
    }
    TPZConnect::RemoveDepend(in_stack_fffffffffffffcb0);
  }
  bVar2 = TPZConnect::Order(local_148);
  local_14c = (uint)bVar2;
  TPZCompMesh::SetDefaultOrder(local_30,local_14c);
  pTVar9 = TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffffcb8);
  TPZGeoEl::ResetReference(pTVar9);
  (**(code **)(*local_78 + 0x68))();
  (**(code **)(*local_78 + 0x2d8))(local_78,local_14c);
  TPZGeoElBC::TPZGeoElBC
            ((TPZGeoElBC *)in_stack_fffffffffffffcd0,(TPZGeoElSide *)in_stack_fffffffffffffcc8,
             (int)((ulong)in_stack_fffffffffffffcc0 >> 0x20));
  TPZCompMesh::ApproxSpace(local_30);
  TPZGeoElBC::CreatedElement(&local_168);
  local_158 = TPZCreateApproximationSpace::CreateCompEl
                        (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                         in_stack_fffffffffffffcb8);
  bVar2 = TPZConnect::Order(local_148);
  if (bVar2 != local_14c) {
    pzinternal::DebugStopImpl(in_stack_000000d0,in_stack_000000c8);
  }
  if (local_158 == (TPZCompEl *)0x0) {
    local_290 = (long *)0x0;
  }
  else {
    local_290 = (long *)__dynamic_cast(local_158,&TPZCompEl::typeinfo,
                                       &TPZInterpolatedElement::typeinfo,0);
  }
  local_170 = local_290;
  pTVar9 = TPZGeoElBC::CreatedElement(&local_168);
  local_174 = (**(code **)(*(long *)pTVar9 + 0xf0))();
  local_174 = local_174 + -1;
  (**(code **)(*local_170 + 0x2f8))(local_170,local_174,1);
  pTVar9 = TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffffcb8);
  TPZGeoEl::ResetReference(pTVar9);
  pTVar9 = TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffffcb8);
  TPZGeoEl::ResetReference(pTVar9);
  iVar7 = TPZVec<TPZCompElSide>::size(local_140);
  if (iVar7 == 0) {
    pTVar9 = TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffffcb8);
    TPZGeoEl::ResetReference(pTVar9);
    (**(code **)(*local_80 + 0x68))();
    TPZCompElSide::Side(local_20);
    local_180 = TPZInterpolatedElement::SideConnect
                          ((TPZInterpolatedElement *)
                           CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                           (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
                           (int)in_stack_fffffffffffffcd0);
    bVar2 = TPZConnect::Order(local_180);
    plVar1 = local_80;
    local_184 = (uint)bVar2;
    uVar3 = TPZConnect::Order(local_180);
    (**(code **)(*plVar1 + 0x2d8))(plVar1,uVar3);
    TPZGeoElBC::TPZGeoElBC
              ((TPZGeoElBC *)in_stack_fffffffffffffcd0,(TPZGeoElSide *)in_stack_fffffffffffffcc8,
               (int)((ulong)in_stack_fffffffffffffcc0 >> 0x20));
    TPZCompMesh::ApproxSpace(local_30);
    TPZGeoElBC::CreatedElement(&local_190);
    local_160 = (TPZCompMesh *)
                TPZCreateApproximationSpace::CreateCompEl
                          (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                           in_stack_fffffffffffffcb8);
    iVar4 = (int)((ulong)in_stack_fffffffffffffcc0 >> 0x20);
    bVar2 = TPZConnect::Order(local_180);
    if (bVar2 != local_184) {
      pzinternal::DebugStopImpl(in_stack_000000d0,in_stack_000000c8);
    }
    if (local_160 == (TPZCompMesh *)0x0) {
      local_318 = (long *)0x0;
    }
    else {
      local_318 = (long *)__dynamic_cast(local_160,&TPZCompEl::typeinfo,
                                         &TPZInterpolatedElement::typeinfo,0);
    }
    local_198 = local_318;
    pTVar9 = TPZGeoElBC::CreatedElement(&local_190);
    local_19c = (**(code **)(*(long *)pTVar9 + 0xf0))();
    local_19c = local_19c + -1;
    (**(code **)(*local_198 + 0x2f8))(local_198,local_19c,1);
    in_stack_fffffffffffffcd0 = TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffffcb8);
    TPZGeoEl::ResetReference(in_stack_fffffffffffffcd0);
    in_stack_fffffffffffffcc8 =
         (TPZCreateApproximationSpace *)TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffffcb8)
    ;
    TPZGeoEl::ResetReference((TPZGeoEl *)in_stack_fffffffffffffcc8);
  }
  else {
    pTVar8 = TPZVec<TPZCompElSide>::operator[](local_140,0);
    in_stack_fffffffffffffcb8 = (TPZCompMesh *)TPZCompElSide::Element(pTVar8);
    iVar4 = (int)((ulong)pTVar8 >> 0x20);
    local_160 = in_stack_fffffffffffffcb8;
  }
  (**(code **)(*(long *)local_158 + 0x68))();
  (**(code **)(*(long *)local_160 + 0x68))();
  local_1ac = in_RSI[1];
  TPZGeoElBC::TPZGeoElBC
            ((TPZGeoElBC *)in_stack_fffffffffffffcd0,(TPZGeoElSide *)in_stack_fffffffffffffcc8,iVar4
            );
  pTVar9 = TPZGeoElBC::CreatedElement(&local_1b8);
  local_1a8 = TPZGeoEl::Index(pTVar9);
  local_1b0 = local_14c;
  (**(code **)(*local_78 + 0x68))();
  (**(code **)(*local_80 + 0x68))();
  std::make_tuple<long&,int&>((long *)in_stack_fffffffffffffcb8,(int *)pTVar9);
  TPZStack<TPZCompElSide,_10>::~TPZStack((TPZStack<TPZCompElSide,_10> *)0x1f52e09);
  TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1f52e16);
  TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1f52e23);
  tVar10.super__Tuple_impl<0UL,_long,_int>.super__Head_base<0UL,_long,_false>._M_head_impl =
       extraout_RDX._M_head_impl;
  tVar10.super__Tuple_impl<0UL,_long,_int>._0_8_ = in_RDI;
  return (tuple<long,_int>)tVar10.super__Tuple_impl<0UL,_long,_int>;
}

Assistant:

std::tuple<int64_t, int> TPZHybridizeHDiv::SplitConnects(const TPZCompElSide &left, const TPZCompElSide &right, TPZVec<TPZCompMesh *> &meshvec_Hybrid) {
    if (fHDivWrapMatid == 0 || fLagrangeInterface == 0) {
        std::cerr << "Using uninitialized TPZHybridizeHDiv object. You need to call ComputePeriferalMaterialIds function first!" << std::endl;
        DebugStop();
    }
    TPZCompMesh *fluxmesh = meshvec_Hybrid[0];
    //TPZCompMesh *pressuremesh = meshvec[1];
    //TPZGeoMesh *gmesh = fluxmesh->Reference();
    TPZGeoElSide gleft(left.Reference());
    TPZGeoElSide gright(right.Reference());
    TPZInterpolatedElement *intelleft = dynamic_cast<TPZInterpolatedElement *> (left.Element());
    TPZInterpolatedElement *intelright = dynamic_cast<TPZInterpolatedElement *> (right.Element());
    intelleft->SetSideOrient(left.Side(), 1);
    intelright->SetSideOrient(right.Side(), 1);
    TPZStack<TPZCompElSide> equalright;
    TPZConnect &cleft = intelleft->SideConnect(0, left.Side());

    if (cleft.HasDependency()) {
        // check whether the wrap of the large element was already created
        gright.EqualLevelCompElementList(equalright,1,0);
        // only one wrap element should exist
#ifdef PZDEBUG
        if(equalright.size() > 1)
        {
            DebugStop();
        }
        if(equalright.size()==1)
        {
            TPZGeoEl *equalgel = equalright[0].Element()->Reference();
            if(equalgel->Dimension() != fluxmesh->Dimension()-1)
            {
                DebugStop();
            }
        }
#endif
        // reset the reference of the wrap element
        if(equalright.size()) equalright[0].Element()->Reference()->ResetReference();
        cleft.RemoveDepend();
    }
    else
    {
        left.SplitConnect(right);
    }
    int sideorder = cleft.Order();
    fluxmesh->SetDefaultOrder(sideorder);
    // create HDivBound on the sides of the elements
    TPZCompEl *wrap1, *wrap2;
    {
        intelright->Reference()->ResetReference();
        intelleft->LoadElementReference();
        intelleft->SetPreferredOrder(sideorder);
        TPZGeoElBC gbc(gleft, fHDivWrapMatid);
        wrap1 = fluxmesh->ApproxSpace().CreateCompEl(gbc.CreatedElement(), *fluxmesh);
        if(cleft.Order() != sideorder)
        {
            DebugStop();
        }
        TPZInterpolatedElement *intel = dynamic_cast<TPZInterpolatedElement *> (wrap1);
        int wrapside = gbc.CreatedElement()->NSides() - 1;
        intel->SetSideOrient(wrapside, 1);
        intelleft->Reference()->ResetReference();
        wrap1->Reference()->ResetReference();
    }
    // if the wrap of the large element was not created...
    if(equalright.size() == 0)
    {
        intelleft->Reference()->ResetReference();
        intelright->LoadElementReference();
        TPZConnect &cright = intelright->SideConnect(0,right.Side());
        int rightprevorder = cright.Order();
        intelright->SetPreferredOrder(cright.Order());
        TPZGeoElBC gbc(gright, fHDivWrapMatid);
        wrap2 = fluxmesh->ApproxSpace().CreateCompEl(gbc.CreatedElement(), *fluxmesh);
        if(cright.Order() != rightprevorder)
        {
            DebugStop();
        }
        TPZInterpolatedElement *intel = dynamic_cast<TPZInterpolatedElement *> (wrap2);
        int wrapside = gbc.CreatedElement()->NSides() - 1;
        intel->SetSideOrient(wrapside, 1);
        intelright->Reference()->ResetReference();
        wrap2->Reference()->ResetReference();
    }
    else
    {
        wrap2 = equalright[0].Element();
    }
    wrap1->LoadElementReference();
    wrap2->LoadElementReference();
    int64_t pressureindex;
    int lagmatid = fLagrangeInterface;
    int pressureorder;
    {
        TPZGeoElBC gbc(gleft, lagmatid);
        pressureindex = gbc.CreatedElement()->Index();
        pressureorder = sideorder;
    }
    intelleft->LoadElementReference();
    intelright->LoadElementReference();
    return std::make_tuple(pressureindex, pressureorder);
}